

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_setreleasehook(HSQUIRRELVM v,SQInteger idx,SQRELEASEHOOK hook)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *ud;
  SQRELEASEHOOK hook_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  pSVar2 = stack_get(v,idx);
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_CLASS) {
    ((pSVar2->super_SQObject)._unVal.pClass)->_hook = hook;
  }
  else if (SVar1 == OT_USERDATA) {
    ((pSVar2->super_SQObject)._unVal.pUserData)->_hook = hook;
  }
  else if (SVar1 == OT_INSTANCE) {
    ((pSVar2->super_SQObject)._unVal.pInstance)->_hook = hook;
  }
  return;
}

Assistant:

void sq_setreleasehook(HSQUIRRELVM v,SQInteger idx,SQRELEASEHOOK hook)
{
    SQObjectPtr &ud=stack_get(v,idx);
    switch( type(ud) ) {
    case OT_USERDATA:   _userdata(ud)->_hook = hook;    break;
    case OT_INSTANCE:   _instance(ud)->_hook = hook;    break;
    case OT_CLASS:      _class(ud)->_hook = hook;       break;
    default: return;
    }
}